

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  BYTE *src;
  ZSTD_customMem *pZVar4;
  bool bVar5;
  ZSTD_nextInputType_e ZVar6;
  ZSTD_DDict *pZVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  ZSTD_dStage ZVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  void *src_00;
  ulong uVar16;
  size_t sStackY_e0;
  char *op;
  char *local_b8;
  ZSTD_frameHeader *local_b0;
  BYTE *local_a8;
  void *local_a0;
  void *local_98;
  ZSTD_outBuffer *local_90;
  ZSTD_inBuffer *local_88;
  size_t *local_80;
  ZSTD_outBuffer *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  void *local_58;
  char *local_50;
  ulong local_48;
  ZSTD_customMem *local_40;
  ulong local_38;
  
  local_58 = input->src;
  local_68 = input->size;
  local_70 = input->pos;
  pvVar3 = output->dst;
  local_60 = output->size;
  local_48 = output->pos;
  op = (char *)((long)pvVar3 + local_48);
  local_38 = local_68 - local_70;
  if (local_68 < local_70) {
    sStackY_e0 = 0xffffffffffffffb8;
  }
  else {
    sStackY_e0 = 0xffffffffffffffba;
    if ((local_48 <= local_60) &&
       (((zds->outBufferMode != ZSTD_bm_stable || (zds->streamStage == zdss_init)) ||
        ((sStackY_e0 = 0xffffffffffffff98, (zds->expectedOutBuffer).dst == pvVar3 &&
         (((zds->expectedOutBuffer).pos == local_48 && ((zds->expectedOutBuffer).size == local_60)))
         ))))) {
      local_98 = (void *)((long)local_58 + local_70);
      local_a0 = (void *)(local_68 + (long)local_58);
      local_b8 = (char *)((long)pvVar3 + local_60);
      local_78 = &zds->expectedOutBuffer;
      local_80 = &zds->outStart;
      local_b0 = &zds->fParams;
      local_a8 = zds->headerBuffer;
      local_40 = &zds->customMem;
      bVar5 = false;
      pvVar3 = local_98;
      local_90 = output;
      local_88 = input;
      local_50 = op;
LAB_001a9c5c:
      do {
        src_00 = pvVar3;
        pcVar8 = op;
        if (bVar5) {
          local_88->pos = (long)src_00 - (long)local_88->src;
          sVar10 = (long)op - (long)output->dst;
          output->pos = sVar10;
          local_78->pos = sVar10;
          sVar10 = output->size;
          local_78->dst = output->dst;
          local_78->size = sVar10;
          if (local_50 == op && local_98 == src_00) {
            iVar2 = zds->noForwardProgress;
            zds->noForwardProgress = iVar2 + 1;
            if (0xe < iVar2) {
              if (local_48 == local_60) {
                return 0xffffffffffffffb0;
              }
              if (local_68 != local_70) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa44d,
                              "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                             );
              }
              return 0xffffffffffffffae;
            }
          }
          else {
            zds->noForwardProgress = 0;
          }
          sVar10 = zds->expected;
          if (sVar10 != 0) {
            ZVar6 = ZSTD_nextInputType(zds);
            uVar14 = (ulong)(ZVar6 == ZSTDnit_block) * 3 + sVar10;
            if (uVar14 < zds->inPos) {
              __assert_fail("zds->inPos <= nextSrcSizeHint",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa466,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            return uVar14 - zds->inPos;
          }
          if (zds->outEnd != zds->outStart) {
            if (zds->hostageByte == 0) {
              local_88->pos = local_88->pos - 1;
              zds->hostageByte = 1;
              return 1;
            }
            return 1;
          }
          if (zds->hostageByte != 0) {
            if (local_88->size <= local_88->pos) {
              zds->streamStage = zdss_read;
              return 1;
            }
            local_88->pos = local_88->pos + 1;
          }
          return 0;
        }
        pvVar3 = src_00;
        switch(zds->streamStage) {
        case zdss_init:
          zds->streamStage = zdss_loadHeader;
          zds->inPos = 0;
          *(undefined8 *)((long)local_80 + 0xc) = 0;
          *(undefined8 *)((long)local_80 + 0x14) = 0;
          *local_80 = 0;
          local_80[1] = 0;
          local_78->pos = output->pos;
          sVar10 = output->size;
          local_78->dst = output->dst;
          local_78->size = sVar10;
          sVar10 = 0;
          break;
        case zdss_loadHeader:
          sVar10 = zds->lhSize;
          break;
        case zdss_read:
          goto switchD_001a9c85_caseD_2;
        case zdss_load:
          uVar14 = (long)local_a0 - (long)src_00;
          goto LAB_001aa0d8;
        case zdss_flush:
          sVar10 = zds->outStart;
          uVar16 = zds->outEnd - sVar10;
          uVar15 = (long)local_b8 - (long)op;
          uVar14 = uVar16;
          if (uVar15 < uVar16) {
            uVar14 = uVar15;
          }
          if (uVar14 != 0) {
            memcpy(op,zds->outBuff + sVar10,uVar14);
            sVar10 = zds->outStart;
          }
          op = pcVar8 + uVar14;
          if (pcVar8 == (char *)0x0) {
            op = pcVar8;
          }
          *local_80 = sVar10 + uVar14;
          bVar5 = true;
          output = local_90;
          if (uVar16 <= uVar15) {
            zds->streamStage = zdss_read;
            bVar5 = false;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (bVar5 = false,
               zds->outBuffSize < sVar10 + uVar14 + (ulong)(zds->fParams).blockSizeMax)) {
              *local_80 = 0;
              local_80[1] = 0;
              bVar5 = false;
            }
          }
          goto LAB_001a9c5c;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa43d,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        sVar10 = ZSTD_getFrameHeader_advanced(local_b0,local_a8,sVar10,zds->format);
        if ((zds->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
           (zds->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
          ZSTD_DCtx_selectFrameDDict(zds);
        }
        uVar14 = local_38;
        src = local_a8;
        pcVar8 = op;
        if (0xffffffffffffff88 < sVar10) {
          return sVar10;
        }
        if (sVar10 != 0) {
          uVar14 = (long)local_a0 - (long)src_00;
          if (local_a0 < src_00) {
            __assert_fail("iend >= ip",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa38d,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          sVar13 = zds->lhSize;
          sVar9 = sVar10 - sVar13;
          if (uVar14 < sVar9) {
            if (local_a0 != src_00) {
              memcpy(local_a8 + sVar13,src_00,uVar14);
              sVar13 = uVar14 + zds->lhSize;
              zds->lhSize = sVar13;
            }
            local_88->pos = local_88->size;
            sVar13 = ZSTD_getFrameHeader_advanced(local_b0,src,sVar13,zds->format);
            if (sVar13 < 0xffffffffffffff89) {
              uVar14 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
              if (sVar10 < uVar14) {
                sVar10 = uVar14;
              }
              return (sVar10 - zds->lhSize) + 3;
            }
            return sVar13;
          }
          if (src_00 == (void *)0x0) {
            __assert_fail("ip != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa39b,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          memcpy(local_a8 + sVar13,src_00,sVar9);
          zds->lhSize = sVar10;
LAB_001aa1a3:
          bVar5 = false;
          pvVar3 = (void *)((long)src_00 + sVar9);
          goto LAB_001a9c5c;
        }
        if ((((local_b0->frameContentSize != 0xffffffffffffffff) &&
             ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
            (uVar15 = (long)local_b8 - (long)op, local_b0->frameContentSize <= uVar15)) &&
           (sVar10 = ZSTD_findFrameCompressedSize(local_98,local_38), output = local_90,
           sVar10 <= uVar14)) {
          pZVar7 = ZSTD_getDDict(zds);
          sVar13 = ZSTD_decompress_usingDDict(zds,pcVar8,uVar15,local_98,sVar10,pZVar7);
          if (0xffffffffffffff88 < sVar13) {
            return sVar13;
          }
          if (local_58 == (void *)0x0) {
            __assert_fail("istart != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa3aa,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          op = pcVar8 + sVar13;
          if (pcVar8 == (char *)0x0) {
            op = pcVar8;
          }
          zds->expected = 0;
          zds->streamStage = zdss_init;
          bVar5 = true;
          pvVar3 = (void *)(sVar10 + (long)local_98);
          goto LAB_001a9c5c;
        }
        if (((zds->outBufferMode == ZSTD_bm_stable) &&
            ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
           ((local_b0->frameContentSize != 0xffffffffffffffff &&
            ((ulong)((long)local_b8 - (long)op) < local_b0->frameContentSize)))) {
          return 0xffffffffffffffba;
        }
        pZVar7 = ZSTD_getDDict(zds);
        ZSTD_decompressBegin_usingDDict(zds,pZVar7);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar14 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar11 = ZSTDds_skipFrame;
        }
        else {
          sVar10 = ZSTD_decodeFrameHeader(zds,local_a8,zds->lhSize);
          uVar14 = 3;
          ZVar11 = ZSTDds_decodeBlockHeader;
          if (0xffffffffffffff88 < sVar10) {
            return sVar10;
          }
        }
        pZVar4 = local_40;
        zds->expected = uVar14;
        zds->stage = ZVar11;
        uVar14 = (zds->fParams).windowSize;
        if (uVar14 < 0x401) {
          uVar14 = 0x400;
        }
        (zds->fParams).windowSize = uVar14;
        if (zds->maxWindowSize < uVar14) {
          return 0xfffffffffffffff0;
        }
        uVar1 = (zds->fParams).blockSizeMax;
        uVar15 = (ulong)uVar1;
        if (uVar1 < 5) {
          uVar15 = 4;
        }
        if (zds->outBufferMode == ZSTD_bm_buffered) {
          uVar16 = 0x20000;
          if (uVar14 < 0x20000) {
            uVar16 = uVar14;
          }
          uVar16 = uVar14 + uVar16 + 0x20040;
          uVar14 = local_b0->frameContentSize;
          if (uVar16 < local_b0->frameContentSize) {
            uVar14 = uVar16;
          }
        }
        else {
          uVar14 = 0;
        }
        uVar16 = uVar14 + uVar15;
        if (zds->outBuffSize + zds->inBuffSize < uVar16 * 3) {
          uVar12 = 0;
        }
        else {
          uVar12 = zds->oversizedDuration + 1;
        }
        zds->oversizedDuration = uVar12;
        if ((zds->inBuffSize < uVar15) || (0x7f < uVar12 || zds->outBuffSize < uVar14)) {
          uVar12 = zds->staticSize;
          if (uVar12 == 0) {
            ZSTD_customFree(zds->inBuff,*local_40);
            output = local_90;
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            pcVar8 = (char *)ZSTD_customMalloc(uVar16,*pZVar4);
            zds->inBuff = pcVar8;
            if (pcVar8 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (uVar12 < 0x176e0) {
              __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa3e3,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            if (uVar12 - 0x176e0 < uVar16) {
              return 0xffffffffffffffc0;
            }
            pcVar8 = zds->inBuff;
          }
          zds->inBuffSize = uVar15;
          zds->outBuff = pcVar8 + uVar15;
          zds->outBuffSize = uVar14;
        }
        zds->streamStage = zdss_read;
switchD_001a9c85_caseD_2:
        uVar14 = (long)local_a0 - (long)src_00;
        sVar9 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,uVar14);
        if (sVar9 == 0) {
          zds->streamStage = zdss_init;
          bVar5 = true;
          goto LAB_001a9c5c;
        }
        if (sVar9 <= uVar14) {
          sVar10 = ZSTD_decompressContinueStream(zds,&op,local_b8,src_00,sVar9);
          if (0xffffffffffffff88 < sVar10) {
            return sVar10;
          }
          if (src_00 == (void *)0x0) {
            __assert_fail("ip != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa400,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          goto LAB_001aa1a3;
        }
        bVar5 = true;
        pvVar3 = local_a0;
        if (src_00 == local_a0) goto LAB_001a9c5c;
        zds->streamStage = zdss_load;
LAB_001aa0d8:
        sVar10 = zds->expected;
        sVar13 = zds->inPos;
        sVar9 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,uVar14);
        if (sVar10 != sVar9) {
          __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,41999,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        uVar15 = sVar10 - sVar13;
        if (zds->stage == ZSTDds_skipFrame) {
          if (uVar15 < uVar14) {
            uVar14 = uVar15;
          }
          if (uVar14 != 0) goto LAB_001aa155;
LAB_001aa1ad:
          uVar14 = 0;
        }
        else {
          if (zds->inBuffSize - sVar13 < uVar15) {
            return 0xffffffffffffffec;
          }
          if (uVar15 < uVar14) {
            uVar14 = uVar15;
          }
          if (uVar14 == 0) goto LAB_001aa1ad;
          memcpy(zds->inBuff + sVar13,src_00,uVar14);
          sVar13 = zds->inPos;
LAB_001aa155:
          src_00 = (void *)((long)src_00 + uVar14);
          zds->inPos = sVar13 + uVar14;
        }
        output = local_90;
        bVar5 = true;
        pvVar3 = src_00;
        if (uVar14 < uVar15) goto LAB_001a9c5c;
        zds->inPos = 0;
        sStackY_e0 = ZSTD_decompressContinueStream(zds,&op,local_b8,zds->inBuff,sVar10);
        bVar5 = false;
      } while (sStackY_e0 < 0xffffffffffffff89);
    }
  }
  return sStackY_e0;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            zds->legacyVersion = 0;
#endif
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            ZSTD_FALLTHROUGH;

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        /* check first few bytes */
                        FORWARD_IF_ERROR(
                            ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format),
                            "First few bytes detected incorrect" );
                        /* return hint input size */
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    assert(istart != NULL);
                    ip = istart + cSize;
                    op = op ? op + decompressedSize : op; /* can occur if frameContentSize = 0 (empty frame) */
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            ZSTD_FALLTHROUGH;

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    assert(ip != NULL);
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            ZSTD_FALLTHROUGH;

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip)));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                if (loadedSize != 0) {
                    /* ip may be NULL */
                    ip += loadedSize;
                    zds->inPos += loadedSize;
                }
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {
                size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);

                op = op ? op + flushedSize : op;

                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                        && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, noForwardProgress_destFull, "");
            RETURN_ERROR_IF(ip==iend, noForwardProgress_inputEmpty, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}